

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall FIX::SocketInitiator::~SocketInitiator(SocketInitiator *this)

{
  _Base_ptr p_Var1;
  
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__SocketInitiator_001f05c0;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketInitiator_001f0640;
  for (p_Var1 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  for (p_Var1 = (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::~_Rb_tree(&(this->m_connections)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::~_Rb_tree(&(this->m_pendingConnections)._M_t);
  SocketMonitor::~SocketMonitor(&(this->m_connector).m_monitor);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_int>,_std::_Select1st<std::pair<const_FIX::SessionID,_int>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_int>_>_>
  ::~_Rb_tree(&(this->m_sessionToHostNum)._M_t);
  SessionSettings::~SessionSettings(&this->m_settings);
  Initiator::~Initiator(&this->super_Initiator);
  return;
}

Assistant:

SocketInitiator::~SocketInitiator()
{
  SocketConnections::iterator i;
  for (i = m_connections.begin();
       i != m_connections.end(); ++i)
    delete i->second;

  for (i = m_pendingConnections.begin();
       i != m_pendingConnections.end(); ++i)
    delete i->second;
}